

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall AActor::SetOrigin(AActor *this,double x,double y,double z,bool moving)

{
  bool moving_local;
  double z_local;
  double y_local;
  double x_local;
  AActor *this_local;
  
  UnlinkFromWorld(this);
  SetXYZ(this,x,y,z);
  LinkToWorld(this,false,(sector_t *)0x0);
  P_FindFloorCeiling(this,1);
  if (!moving) {
    ClearInterpolation(this);
  }
  return;
}

Assistant:

void AActor::SetOrigin(double x, double y, double z, bool moving)
{
	UnlinkFromWorld ();
	SetXYZ(x, y, z);
	LinkToWorld ();
	P_FindFloorCeiling(this, FFCF_ONLYSPAWNPOS);
	if (!moving) ClearInterpolation();
}